

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::parseIdentifier(Parser *this,Identifier *dest)

{
  Token *this_00;
  Identifier *pIVar1;
  bool bVar2;
  Token *tok;
  Identifier *dest_local;
  Parser *this_local;
  
  this_00 = nextToken(this);
  bVar2 = this_00->type == Identifier;
  if (bVar2) {
    pIVar1 = Token::identifierValue(this_00);
    Identifier::operator=(dest,pIVar1);
  }
  return bVar2;
}

Assistant:

bool Parser::parseIdentifier(Identifier& dest)
{
	const Token& tok = nextToken();
	if (tok.type != TokenType::Identifier)
		return false;

	dest = tok.identifierValue();
	return true;
}